

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O3

void __thiscall serialization::json_iarchive::load_data(json_iarchive *this,char *data)

{
  undefined8 *puVar1;
  GenericStringStream<rapidjson::UTF8<char>_> s;
  GenericStringStream<rapidjson::UTF8<char>_> local_18;
  
  local_18.src_ = data;
  local_18.head_ = data;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)this,&local_18);
  if ((this->doc_).parseResult_.code_ == kParseErrorNone) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar1 = &PTR__exception_00120d50;
  puVar1[1] = "parse";
  puVar1[2] = "json";
  __cxa_throw(puVar1,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

void load_data(const char * data)
    {
        doc_.Parse(data);
        if(doc_.GetParseError())
        {
            throw_serialization_error("json", "parse");
        }
    }